

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

void __thiscall xmrig::Pool::Pool(Pool *this,Value *object)

{
  ushort uVar1;
  SizeType SVar2;
  bool bVar3;
  SizeType SVar4;
  char *pcVar5;
  EVP_PKEY_CTX *pEVar6;
  uint64_t uVar7;
  Value *pVVar8;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  Mode MVar9;
  Url local_60;
  
  this->m_keepAlive = 0;
  this->m_mode = MODE_POOL;
  (this->m_flags).super__Base_bitset<1UL>._M_w = 1;
  (this->m_fingerprint).m_data = (char *)0x0;
  (this->m_fingerprint).m_size = 0;
  (this->m_password).m_data = (char *)0x0;
  (this->m_password).m_size = 0;
  (this->m_rigId).m_data = (char *)0x0;
  (this->m_rigId).m_size = 0;
  (this->m_user).m_data = (char *)0x0;
  (this->m_user).m_size = 0;
  this->m_pollInterval = 1000;
  (this->m_daemon).m_tls = false;
  *(undefined8 *)&(this->m_daemon).m_scheme = 0;
  *(undefined8 *)((long)&(this->m_daemon).m_host.m_data + 4) = 0;
  *(undefined8 *)((long)&(this->m_daemon).m_host.m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_daemon).m_url.m_data + 4) = 0;
  *(undefined4 *)((long)&(this->m_daemon).m_url.m_size + 4) = 0;
  (this->m_daemon).m_port = 0xd05;
  pcVar5 = Json::getString(object,"url",(char *)0x0);
  Url::Url(&this->m_url,pcVar5);
  if ((this->m_url).m_host.m_data == (char *)0x0) {
    return;
  }
  if ((this->m_url).m_port == 0) {
    return;
  }
  pEVar6 = (EVP_PKEY_CTX *)Json::getString(object,"user",(char *)0x0);
  String::copy(&this->m_user,pEVar6,src);
  pEVar6 = (EVP_PKEY_CTX *)Json::getString(object,"pass",(char *)0x0);
  String::copy(&this->m_password,pEVar6,src_00);
  pEVar6 = (EVP_PKEY_CTX *)Json::getString(object,"rig-id",(char *)0x0);
  String::copy(&this->m_rigId,pEVar6,src_01);
  pEVar6 = (EVP_PKEY_CTX *)Json::getString(object,"tls-fingerprint",(char *)0x0);
  String::copy(&this->m_fingerprint,pEVar6,src_02);
  uVar7 = Json::getUint64(object,"daemon-poll-interval",1000);
  this->m_pollInterval = uVar7;
  pcVar5 = Json::getString(object,"self-select",(char *)0x0);
  Url::Url(&local_60,pcVar5);
  Url::operator=(&this->m_daemon,&local_60);
  Url::~Url(&local_60);
  MVar9 = MODE_DAEMON;
  bVar3 = Json::getBool(object,"enabled",true);
  std::bitset<2UL>::set(&this->m_flags,0,bVar3);
  bVar3 = Json::getBool(object,"tls",false);
  std::bitset<2UL>::set(&this->m_flags,1,(bool)(bVar3 | (this->m_url).m_tls & 1U));
  if (((this->m_daemon).m_host.m_data == (char *)0x0) || ((this->m_daemon).m_port == 0)) {
    bVar3 = Json::getBool(object,"daemon",false);
    if (!bVar3) goto LAB_001571eb;
  }
  else {
    MVar9 = MODE_SELF_SELECT;
  }
  this->m_mode = MVar9;
LAB_001571eb:
  pVVar8 = Json::getValue(object,"keepalive");
  uVar1 = (pVVar8->data_).f.flags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 8) == 0) {
      return;
    }
    SVar4 = 0x3c;
    if (uVar1 != 10) {
      SVar4 = 0;
    }
  }
  else {
    SVar2 = (pVVar8->data_).s.length;
    SVar4 = 0;
    if (0 < (int)SVar2) {
      SVar4 = SVar2;
    }
  }
  this->m_keepAlive = SVar4;
  return;
}

Assistant:

xmrig::Pool::Pool(const rapidjson::Value &object) :
    m_flags(1 << FLAG_ENABLED),
    m_pollInterval(kDefaultPollInterval),
    m_url(Json::getString(object, kUrl))
{
    if (!m_url.isValid()) {
        return;
    }

    m_user         = Json::getString(object, kUser);
    m_password     = Json::getString(object, kPass);
    m_rigId        = Json::getString(object, kRigId);
    m_fingerprint  = Json::getString(object, kFingerprint);
    m_pollInterval = Json::getUint64(object, kDaemonPollInterval, kDefaultPollInterval);
    m_daemon       = Json::getString(object, kSelfSelect);

    m_flags.set(FLAG_ENABLED,  Json::getBool(object, kEnabled, true));
    m_flags.set(FLAG_TLS,      Json::getBool(object, kTls) || m_url.isTLS());

    if (m_daemon.isValid()) {
        m_mode = MODE_SELF_SELECT;
    }
    else if (Json::getBool(object, kDaemon)) {
        m_mode = MODE_DAEMON;
    }

    const rapidjson::Value &keepalive = Json::getValue(object, kKeepalive);
    if (keepalive.IsInt()) {
        setKeepAlive(keepalive.GetInt());
    }
    else if (keepalive.IsBool()) {
        setKeepAlive(keepalive.GetBool());
    }
}